

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O2

int __thiscall
HEVCStreamReader::getTSDescriptor
          (HEVCStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  byte bVar1;
  HevcSpsUnit *pHVar2;
  int iVar3;
  int iVar4;
  byte *buffer;
  ulong uVar5;
  uint height;
  undefined7 in_register_00000011;
  uint width;
  ulong uVar6;
  uint8_t *puVar7;
  uint8_t aspect_ratio_index;
  uint8_t frame_rate_index;
  undefined4 local_244;
  undefined8 local_240;
  CheckStreamRez rez;
  
  if (this->m_firstFrame == true) {
    puVar7 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer;
    checkStream(&rez,this,puVar7,
                *(int *)&(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd -
                (int)puVar7);
    CheckStreamRez::~CheckStreamRez(&rez);
  }
  local_240 = 0;
  if ((!blurayMode) && (this->m_hdr->isDVRPU == true)) {
    builtin_memcpy(dstBuff,"\x05\x04DOVI",6);
    dstBuff = dstBuff + 6;
    local_240 = 6;
  }
  local_244 = (undefined4)CONCAT71(in_register_00000011,blurayMode);
  if (hdmvDescriptors) {
    dstBuff[0] = '\x05';
    dstBuff[1] = '\b';
    dstBuff[2] = 'H';
    dstBuff[3] = 'D';
    dstBuff[4] = 'M';
    dstBuff[5] = 'V';
    dstBuff[6] = 0xff;
    dstBuff[7] = '$';
    pHVar2 = this->m_sps;
    if (pHVar2 == (HevcSpsUnit *)0x0) {
      width = 0;
      height = 0;
    }
    else {
      width = pHVar2->pic_width_in_luma_samples;
      height = pHVar2->pic_height_in_luma_samples;
    }
    M2TSStreamInfo::blurayStreamParams
              ((this->super_MPEGStreamReader).m_fps,false,width,height,
               (this->super_MPEGStreamReader).m_streamAR,(uint8_t *)&rez,&frame_rate_index,
               &aspect_ratio_index);
    dstBuff[8] = (char)rez.codecInfo.codecID << 4 | frame_rate_index;
    dstBuff[9] = aspect_ratio_index << 4 | 0xf;
    puVar7 = dstBuff + 10;
  }
  else {
    for (buffer = NALUnit::findNextNAL
                            ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer,
                             (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
        puVar7 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,
        buffer < puVar7 + -4;
        buffer = NALUnit::findNextNAL
                           (buffer,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                   m_bufEnd)) {
      bVar1 = *buffer;
      puVar7 = NALUnit::findNALWithStartCode(buffer,puVar7,true);
      if ((bVar1 & 0x7e) == 0x42) {
        uVar5 = (ulong)(uint)((int)puVar7 - (int)buffer);
        uVar6 = 0x1f8;
        if (uVar5 < 0x1f8) {
          uVar6 = uVar5;
        }
        NALUnit::decodeNAL(buffer,buffer + uVar6,(uint8_t *)&rez,0x200);
        break;
      }
    }
    dstBuff[0] = '8';
    dstBuff[1] = '\r';
    *(undefined8 *)(dstBuff + 2) = rez.codecInfo._3_8_;
    *(undefined4 *)(dstBuff + 10) = rez.codecInfo.displayName._M_dataplus._M_p._3_4_;
    dstBuff[0xe] = (this->m_sps->sub_pic_hrd_params_present_flag ^ 1U) << 4 | 0xf;
    puVar7 = dstBuff + 0xf;
  }
  iVar4 = (int)local_240;
  if (((char)local_244 == '\0') && (this->m_hdr->isDVRPU == true)) {
    iVar3 = setDoViDescriptor(this,puVar7);
    iVar4 = iVar3 + iVar4;
  }
  return (uint)!hdmvDescriptors + (uint)!hdmvDescriptors * 4 + iVar4 + 10;
}

Assistant:

int HEVCStreamReader::getTSDescriptor(uint8_t* dstBuff, const bool blurayMode, const bool hdmvDescriptors)
{
    if (m_firstFrame)
        CheckStreamRez rez = checkStream(m_buffer, static_cast<int>(m_bufEnd - m_buffer));

    int lenDoviDesc = 0;
    if (!blurayMode && m_hdr->isDVRPU)
    {
        // 'DOVI' registration descriptor
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::REGISTRATION);
        *dstBuff++ = 4;  // descriptor length
        *dstBuff++ = 'D';
        *dstBuff++ = 'O';
        *dstBuff++ = 'V';
        *dstBuff++ = 'I';
        lenDoviDesc += 6;
    }

    if (hdmvDescriptors)
    {
        // 'HDMV' registration descriptor
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::HDMV);  // descriptor tag
        *dstBuff++ = 8;                                            // descriptor length
        *dstBuff++ = 'H';
        *dstBuff++ = 'D';
        *dstBuff++ = 'M';
        *dstBuff++ = 'V';
        *dstBuff++ = 0xff;  // stuffing byte

        *dstBuff++ = static_cast<uint8_t>(StreamType::VIDEO_H265);  // stream_conding_type
        uint8_t video_format, frame_rate_index, aspect_ratio_index;
        M2TSStreamInfo::blurayStreamParams(getFPS(), getInterlaced(), getStreamWidth(), getStreamHeight(),
                                           getStreamAR(), &video_format, &frame_rate_index, &aspect_ratio_index);

        *dstBuff++ = static_cast<uint8_t>(video_format << 4 | frame_rate_index);
        *dstBuff++ = static_cast<uint8_t>(aspect_ratio_index << 4 | 0xf);
    }
    else
    {
        uint8_t tmpBuffer[512];

        for (uint8_t* nal = NALUnit::findNextNAL(m_buffer, m_bufEnd); nal < m_bufEnd - 4;
             nal = NALUnit::findNextNAL(nal, m_bufEnd))
        {
            const auto nalType = static_cast<HevcUnit::NalType>((*nal >> 1) & 0x3f);
            const uint8_t* nextNal = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);

            if (nalType == HevcUnit::NalType::SPS)
            {
                const int toDecode = FFMIN(sizeof(tmpBuffer) - 8, (unsigned)(nextNal - nal));
                NALUnit::decodeNAL(nal, nal + toDecode, tmpBuffer, sizeof(tmpBuffer));
                break;
            }
        }

        *dstBuff++ = static_cast<int>(TSDescriptorTag::HEVC);
        *dstBuff++ = 13;  // descriptor length
        memcpy(dstBuff, tmpBuffer + 3, 12);
        dstBuff += 12;
        // flags temporal_layer_subset, HEVC_still_present,
        // HEVC_24hr_picture_present, HDR_WCG unspecified
        *dstBuff++ = m_sps->sub_pic_hrd_params_present_flag ? 0x0f : 0x1f;

        /* HEVC_timing_and_HRD_descriptor
        // mandatory for interlaced video only
        memcpy(dstBuff, "\x3f\x0f\x03\x7f\x7f", 5);
        dstBuff += 5;

        uint32_t N = 1001 * getFPS();
        uint32_t K = 27000000;
        uint32_t num_units_in_tick = 1001;
        if (N % 1000)
        {
            N = 1000 * getFPS();
            num_units_in_tick = 1000;
        }
        N = my_htonl(N);
        K = my_htonl(K);
        num_units_in_tick = my_htonl(num_units_in_tick);
        memcpy(dstBuff, &N, 4);
        dstBuff += 4;
        memcpy(dstBuff, &K, 4);
        dstBuff += 4;
        memcpy(dstBuff, &num_units_in_tick, 4);
        dstBuff += 4;
        */
    }

    if (!blurayMode && m_hdr->isDVRPU)
        lenDoviDesc += setDoViDescriptor(dstBuff);

    return (hdmvDescriptors ? 10 : 15) + lenDoviDesc;
}